

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool bValidReq(json *json,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *keys)

{
  pointer pbVar1;
  bool bVar2;
  reference this;
  long lVar3;
  size_t i;
  ulong uVar4;
  bool bVar5;
  _Bit_iterator _Var6;
  vector<bool,_std::allocator<bool>_> vTest;
  _Bvector_base<std::allocator<bool>_> local_50;
  
  local_50._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_50._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_50._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_50._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_50._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  lVar3 = 0;
  for (uVar4 = 0;
      pbVar1 = (keys->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(keys->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar4 = uVar4 + 1) {
    this = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](json,(key_type *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
    bVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::empty(this);
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)&local_50,!bVar2);
    lVar3 = lVar3 + 0x20;
  }
  _Var6 = std::__find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                    (local_50._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                     _M_p,0,local_50._M_impl.super__Bvector_impl_data._M_finish.
                            super__Bit_iterator_base._M_p,
                     local_50._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                     _M_offset);
  bVar2 = _Var6.super__Bit_iterator_base._M_p ==
          local_50._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  bVar5 = _Var6.super__Bit_iterator_base._M_offset ==
          local_50._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_50);
  return bVar5 && bVar2;
}

Assistant:

bool bValidReq(nlohmann::json json, std::vector<std::string> keys)
{
	std::vector<bool> vTest;

	for (size_t i = 0; i < keys.size(); i++)
	{
		if (!json[keys[i]].empty())
			vTest.push_back(true);
		else
			vTest.push_back(false);
	}

	std::vector<bool>::iterator it = std::find(vTest.begin(), vTest.end(), false);

	if (it != vTest.end())
		return false;
	else
		return true;
}